

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenTest.cpp
# Opt level: O0

void __thiscall UnitTest1::CodeGenTest::DFACodeGenTest1(CodeGenTest *this)

{
  FILE *__stream;
  FILE *in_stack_fffffffffffffcb8;
  FileLogger *in_stack_fffffffffffffcc0;
  void *local_320;
  void *local_318;
  void *local_310;
  char *local_308;
  undefined8 local_300;
  char buf2 [9];
  char buf [13];
  DFARoutineEM64T<char> dfa_routine;
  FileLogger logger;
  FILE *logfile;
  DFA<char> dfa;
  NFA<char> nfa;
  allocator local_71;
  wstring local_70;
  undefined1 local_50 [8];
  Stream stream;
  CodeGenTest *this_local;
  
  stream._56_8_ = this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring((wstring *)&local_70,L"(abc)+def",&local_71);
  Centaurus::Stream::Stream((Stream *)local_50,&local_70);
  std::__cxx11::wstring::~wstring((wstring *)&local_70);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_71);
  Centaurus::NFA<char>::NFA
            ((NFA<char> *)
             &dfa.super_NFABase<Centaurus::DFAState<char>_>.m_states.
              super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Stream *)local_50);
  Centaurus::DFA<char>::DFA
            ((DFA<char> *)&logfile,
             (NFA<char> *)
             &dfa.super_NFABase<Centaurus::DFAState<char>_>.m_states.
              super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
  __stream = fopen("dfaroutine.asm","w");
  asmjit::FileLogger::FileLogger(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  Centaurus::DFARoutineEM64T<char>::DFARoutineEM64T
            ((DFARoutineEM64T<char> *)(buf + 8),(DFA<char> *)&logfile,(Logger *)0x0);
  fflush(__stream);
  builtin_strncpy(buf,"cdef",5);
  stack0xfffffffffffffd10 = 0x6261636261;
  local_300 = 0x6564636261636261;
  buf2[0] = '\0';
  local_308 = buf + 4;
  local_310 = Centaurus::DFARoutineEM64T<char>::operator()
                        ((DFARoutineEM64T<char> *)(buf + 8),buf2 + 8);
  Microsoft::VisualStudio::CppUnitTestFramework::Assert::AreEqual<void_const*>
            (&local_308,&local_310,(wchar_t *)0x0);
  local_318 = (void *)0x0;
  local_320 = Centaurus::DFARoutineEM64T<char>::operator()
                        ((DFARoutineEM64T<char> *)(buf + 8),&local_300);
  Microsoft::VisualStudio::CppUnitTestFramework::Assert::AreEqual<void_const*>
            (&local_318,&local_320,(wchar_t *)0x0);
  Centaurus::DFARoutineEM64T<char>::~DFARoutineEM64T((DFARoutineEM64T<char> *)(buf + 8));
  asmjit::FileLogger::~FileLogger((FileLogger *)0x2a6454);
  Centaurus::DFA<char>::~DFA((DFA<char> *)&logfile);
  Centaurus::NFA<char>::~NFA
            ((NFA<char> *)
             &dfa.super_NFABase<Centaurus::DFAState<char>_>.m_states.
              super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Centaurus::Stream::~Stream((Stream *)local_50);
  return;
}

Assistant:

TEST_METHOD(DFACodeGenTest1)
    {
        using namespace Centaurus;

        Stream stream(L"(abc)+def");
        NFA<char> nfa(stream);
        DFA<char> dfa(nfa);

        FILE *logfile;
        logfile = fopen("dfaroutine.asm", "w");
        asmjit::FileLogger logger(logfile);

        DFARoutineEM64T<char> dfa_routine(dfa);

        fflush(logfile);

        const char buf[] = "abcabcabcdef";
        const char buf2[] = "abcabcde";

        Assert::AreEqual((const void *)(buf + sizeof(buf) - 1), dfa_routine(buf));
        Assert::AreEqual((const void *)NULL, dfa_routine(buf2));
    }